

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O2

string * kiste::parse_parent_class(string *__return_storage_ptr__,string *line)

{
  long lVar1;
  parse_error *ppVar2;
  allocator<char> local_21;
  
  lVar1 = std::__cxx11::string::find_first_not_of((char *)line,0x1090d6);
  if (lVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
    return __return_storage_ptr__;
  }
  if ((line->_M_dataplus)._M_p[lVar1] == ':') {
    lVar1 = std::__cxx11::string::find_first_not_of((char *)line,0x1090d6);
    if (lVar1 != -1) {
      lVar1 = std::__cxx11::string::find_first_of((char *)line,0x1090d6);
      if (lVar1 == -1) {
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)line);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)line);
      lVar1 = std::__cxx11::string::find_first_not_of((char *)line,0x1090d6);
      if (lVar1 == -1) {
        return __return_storage_ptr__;
      }
      ppVar2 = (parse_error *)__cxa_allocate_exception(0x10);
      parse_error::parse_error(ppVar2,"Unexpected trailing characters after parent class name");
      __cxa_throw(ppVar2,&parse_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ppVar2 = (parse_error *)__cxa_allocate_exception(0x10);
    parse_error::parse_error(ppVar2,"Could not find parent class name");
  }
  else {
    ppVar2 = (parse_error *)__cxa_allocate_exception(0x10);
    parse_error::parse_error
              (ppVar2,"Unexpected character after class name, did you forget a \':\'?");
  }
  __cxa_throw(ppVar2,&parse_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto parse_parent_class(const std::string& line) -> std::string
  {
    const auto colonPos = line.find_first_not_of(" \t");
    if (colonPos == line.npos)
    {
      return "";
    }
    if (line[colonPos] != ':')
    {
      throw parse_error("Unexpected character after class name, did you forget a ':'?");
    }
    const auto nameBegin = line.find_first_not_of(" \t", colonPos + 1);
    if (nameBegin == line.npos)
    {
      throw parse_error("Could not find parent class name");
    }
    const auto nameEnd = line.find_first_of(" \t", nameBegin);
    const auto parent_name = (nameEnd == line.npos) ? line.substr(nameBegin)
                                                    : line.substr(nameBegin, nameEnd - nameBegin);

    if (nameEnd != line.npos and line.find_first_not_of(" \t", nameEnd) != line.npos)
    {
      throw parse_error("Unexpected trailing characters after parent class name");
    }

    return parent_name;
  }